

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O1

Result tonk::InitializeAddressHash(void)

{
  ErrorResult *in_RAX;
  Result *success;
  ErrorResult *in_RDI;
  Result result;
  Result local_18;
  
  local_18.Error = in_RAX;
  SecureRandom_Next((tonk *)&local_18,(uint8_t *)&m_SecretSeed,8);
  if (local_18.Error == (ErrorResult *)0x0) {
    in_RDI->Source = (char *)0x0;
  }
  else {
    in_RDI->Source = (char *)local_18.Error;
    local_18.Error = (ErrorResult *)0x0;
  }
  Result::~Result(&local_18);
  return (Result)in_RDI;
}

Assistant:

Result InitializeAddressHash()
{
    Result result = SecureRandom_Next((uint8_t*)&m_SecretSeed, sizeof(m_SecretSeed));
    if (result.IsFail()) {
        return result;
    }

    m_SeedInitialized = true;
    return Result::Success();
}